

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

bool jbcoin::STObject::equivalentSTObject(STObject *obj1,STObject *obj2)

{
  pointer *this;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  undefined1 local_48 [8];
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf2;
  vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> sf1;
  STObject *obj2_local;
  STObject *obj1_local;
  
  getSortedFields((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                  &sf2.
                   super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,obj1);
  getSortedFields((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                  local_48,obj2);
  this = &sf2.super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar2 = std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::begin
                    ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)this
                    );
  iVar3 = std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::end
                    ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)this
                    );
  iVar4 = std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::begin
                    ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                     local_48);
  iVar5 = std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::end
                    ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
                     local_48);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,jbcoin::STObject::equivalentSTObject(jbcoin::STObject_const&,jbcoin::STObject_const&)::__0>
                    (iVar2._M_current,iVar3._M_current,iVar4._M_current,iVar5._M_current);
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::~vector
            ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)local_48);
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::~vector
            ((vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *)
             &sf2.
              super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return bVar1;
}

Assistant:

bool STObject::equivalentSTObject (STObject const& obj1, STObject const& obj2)
{
    auto sf1 = getSortedFields (obj1);
    auto sf2 = getSortedFields (obj2);

    return std::equal (sf1.begin (), sf1.end (), sf2.begin (), sf2.end (),
        [] (STBase const* st1, STBase const* st2)
        {
            return (st1->getSType() == st2->getSType()) &&
                st1->isEquivalent (*st2);
        });
}